

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O2

int __thiscall
Fl_PostScript_Graphics_Driver::start_postscript
          (Fl_PostScript_Graphics_Driver *this,int pagecount,Page_Format format,Page_Layout layout)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  page_format *ppVar5;
  int iVar6;
  page_format *ppVar7;
  char *__s;
  char *__s_00;
  bool bVar8;
  
  iVar6 = 0xc;
  if (format == A4) {
    iVar6 = 0x12;
  }
  this->left_margin = iVar6;
  this->top_margin = iVar6;
  this->page_format_ = layout | format;
  ppVar5 = Fl_Paged_Device::page_formats + format;
  ppVar7 = (page_format *)&Fl_Paged_Device::page_formats[format].height;
  if ((layout >> 8 & 1) != 0) {
    ppVar7 = ppVar5;
    ppVar5 = (page_format *)&Fl_Paged_Device::page_formats[format].height;
  }
  iVar6 = ppVar7->width;
  this->pw_ = (double)ppVar5->width;
  this->ph_ = (double)iVar6;
  fputs("%!PS-Adobe-3.0\n",(FILE *)this->output);
  fputs("%%Creator: FLTK\n",(FILE *)this->output);
  if (1 < this->lang_level_) {
    fprintf((FILE *)this->output,"%%%%LanguageLevel: %i\n");
  }
  this->pages_ = pagecount;
  if (pagecount == 0) {
    fputs("%%Pages: (atend)\n",(FILE *)this->output);
  }
  else {
    fprintf((FILE *)this->output,"%%%%Pages: %i\n",(ulong)(uint)pagecount);
  }
  fprintf((FILE *)this->output,"%%%%BeginFeature: *PageSize %s\n",
          Fl_Paged_Device::page_formats[format].name);
  uVar1 = Fl_Paged_Device::page_formats[format].width;
  uVar2 = Fl_Paged_Device::page_formats[format].height;
  uVar3 = uVar2;
  uVar4 = uVar1;
  if ((layout >> 8 & 1) == 0) {
    uVar3 = uVar1;
    uVar4 = uVar2;
  }
  bVar8 = this->lang_level_ != 3;
  if (bVar8) {
    uVar4 = uVar2;
  }
  if (bVar8) {
    uVar3 = uVar1;
  }
  fprintf((FILE *)this->output,"<</PageSize[%d %d]>>setpagedevice\n",(ulong)uVar3,(ulong)uVar4);
  fputs("%%EndFeature\n",(FILE *)this->output);
  fputs("%%EndComments\n",(FILE *)this->output);
  fputs("%%BeginProlog\n/L { /y2 exch def\n/x2 exch def\n/y1 exch def\n/x1 exch def\nnewpath   x1 y1 moveto x2 y2 lineto\nstroke}\nbind def\n/R { /dy exch def\n/dx exch def\n/y exch def\n/x exch def\nnewpath\nx y moveto\ndx 0 rlineto\n0 dy rlineto\ndx neg 0 rlineto\nclosepath stroke\n} bind def\n/CL {\n/dy exch def\n/dx exch def\n/y exch def\n/x exch def\nnewpath\nx y moveto\ndx 0 rlineto\n0 dy rlineto\ndx neg 0 rlineto\nclosepath\nclip\n} bind def\n/FR { /dy exch def\n/dx exch def\n/y exch def\n/x exch def\ncurrentlinewidth 0 setlinewidth newpath\nx y moveto\ndx 0 rlineto\n0 dy rlineto\ndx neg 0 rlineto\nclosepath fill setlinewidth\n} bind def\n/GS { gsave } bind  def\n/GR { grestore } bind def\n/SP { showpage } bind def\n/LW { setlinewidth } bind def\n/CF /Courier def\n/SF { /CF exch def } bind def\n/fsize 12 def\n/FS { /fsize exch def fsize CF findfont exch scalefont setfont }def \n/GL { setgray } bind def\n/SRGB { setrgbcolor } bind def\n/A85RLE { /ASCII85Decode filter /RunLengthDecode filter } bind def\n/CI { GS /py exch def /px exch def /sy exch def /sx exch def\ntranslate \nsx sy scale px py 8 \n[ px 0 0 py neg 0 py ]\ncurrentfile A85RLE\n false 3 colorimage GR\n} bind def\n/GI { GS /py exch def /px exch def /sy exch def /sx exch def \ntranslate \nsx sy scale px py 8 \n[ px 0 0 py neg 0 py ]\ncurrentfile A85RLE\nimage GR\n} bind def\n/MI { GS /py exch def /px exch def /sy exch def /sx exch def \ntranslate \nsx sy scale px py true \n[ px 0 0 py neg 0 py ]\ncurrentfile A85RLE\nimagemask GR\n} bind def\n/BFP { newpath moveto }  def\n/BP { newpath } bind def \n/PL { lineto } bind def \n/PM { moveto } bind def \n/MT { moveto } bind def \n/LT { lineto } bind def \n/EFP { closepath fill } bind def\n/ELP { stroke } bind def\n/ECP { closepath stroke } bind def\n/LW { setlinewidth } bind def\n/TR { translate } bind def\n/CT { concat } bind def\n/RCT { matrix invertmatrix concat} bind def\n/SC { scale } bind def\n/show_pos_width {GS moveto dup dup stringwidth pop exch length 2 div dup 2 le {pop 9999} if 1 sub exch 3 index exch sub exch div 0 2 index 1 -1 scale ashow pop pop GR} bind def\n"
        ,(FILE *)this->output);
  if (1 < this->lang_level_) {
    fputs("/CII {GS /inter exch def /py exch def /px exch def /sy exch def /sx exch def \ntranslate \nsx sy scale\n/DeviceRGB setcolorspace\n/IDD 8 dict def\nIDD begin\n/ImageType 1 def\n/Width px def\n/Height py def\n/BitsPerComponent 8 def\n/Interpolate inter def\n/DataSource currentfile A85RLE def\n/MultipleDataSources false def\n/ImageMatrix [ px 0 0 py neg 0 py ] def\n/Decode [ 0 1 0 1 0 1 ] def\nend\nIDD image GR} bind def\n/GII {GS /inter exch def /py exch def /px exch def /sy exch def /sx exch def \ntranslate \nsx sy scale\n/DeviceGray setcolorspace\n/IDD 8 dict def\nIDD begin\n/ImageType 1 def\n/Width px def\n/Height py def\n/BitsPerComponent 8 def\n/Interpolate inter def\n/DataSource currentfile A85RLE def\n/MultipleDataSources false def\n/ImageMatrix [ px 0 0 py neg 0 py ] def\n/Decode [ 0 1 ] def\nend\nIDD image GR} bind def\n/ToISO { dup findfont dup length dict copy begin /Encoding ISOLatin1Encoding def currentdict end definefont pop } def\n/Helvetica ToISO /Helvetica-Bold ToISO /Helvetica-Oblique ToISO /Helvetica-BoldOblique ToISO \n/Courier ToISO /Courier-Bold ToISO /Courier-Oblique ToISO /Courier-BoldOblique ToISO \n/Times-Roman ToISO /Times-Bold ToISO /Times-Italic ToISO /Times-BoldItalic ToISO \n/LatinExtA \n[  /Amacron /amacron /Abreve /abreve /Aogonek /aogonek\n /Cacute  /cacute  /Ccircumflex  /ccircumflex  /Cdotaccent  /cdotaccent  /Ccaron  /ccaron \n /Dcaron  /dcaron   /Dcroat  /dcroat\n /Emacron  /emacron  /Ebreve  /ebreve  /Edotaccent  /edotaccent  /Eogonek  /eogonek  /Ecaron  /ecaron\n /Gcircumflex  /gcircumflex  /Gbreve  /gbreve  /Gdotaccent  /gdotaccent  /Gcommaaccent  /gcommaaccent \n /Hcircumflex /hcircumflex  /Hbar  /hbar  \n /Itilde  /itilde  /Imacron  /imacron  /Ibreve  /ibreve  /Iogonek  /iogonek /Idotaccent  /dotlessi  \n /IJ  /ij  /Jcircumflex  /jcircumflex\n /Kcommaaccent  /kcommaaccent  /kgreenlandic  \n /Lacute  /lacute  /Lcommaaccent  /lcommaaccent   /Lcaron  /lcaron  /Ldotaccent /ldotaccent   /Lslash  /lslash \n /Nacute  /nacute  /Ncommaaccent  /ncommaaccent  /Ncaron  /ncaron  /napostrophe  /Eng  /eng  \n /Omacron  /omacron /Obreve ..." /* TRUNCATED STRING LITERAL */
          ,(FILE *)this->output);
    iVar6 = this->lang_level_;
    if (iVar6 == 2) {
      fputs("/pixmap_mat {[ pixmap_sx 0 0 pixmap_sy neg 0 pixmap_sy ]}  bind def\n/pixmap_dict {<< /PatternType 1 /PaintType 1 /TilingType 2 /BBox [0  0  pixmap_sx  pixmap_sy] /XStep pixmap_sx /YStep pixmap_sy\n/PaintProc { begin pixmap_w pixmap_h scale pixmap_sx pixmap_sy 8 pixmap_mat currentfile A85RLE false 3 colorimage end } bind >>\n} bind def\n/pixmap_plot {GS /pixmap_sy exch def /pixmap_sx exch def\n/pixmap_h exch def /pixmap_w exch def\ntranslate\npixmap_dict matrix makepattern setpattern\npixmap_w pixmap_h scale\npixmap_sx pixmap_sy\ntrue\npixmap_mat\ncurrentfile A85RLE\nimagemask\nGR\n} bind def\n"
            ,(FILE *)this->output);
      iVar6 = this->lang_level_;
    }
    if ((2 < iVar6) &&
       (fputs("/CIM {GS /inter exch def /my exch def /mx exch def /py exch def /px exch def /sy exch def /sx exch def \ntranslate \nsx sy scale\n/DeviceRGB setcolorspace\n/IDD 8 dict def\nIDD begin\n/ImageType 1 def\n/Width px def\n/Height py def\n/BitsPerComponent 8 def\n/Interpolate inter def\n/DataSource currentfile A85RLE def\n/MultipleDataSources false def\n/ImageMatrix [ px 0 0 py neg 0 py ] def\n/Decode [ 0 1 0 1 0 1 ] def\nend\n/IMD 8 dict def\nIMD begin\n/ImageType 1 def\n/Width mx def\n/Height my def\n/BitsPerComponent 1 def\n/ImageMatrix [ mx 0 0 my neg 0 my ] def\n/Decode [ 1 0 ] def\nend\n<<\n/ImageType 3\n/InterleaveType 2\n/MaskDict IMD\n/DataDict IDD\n>> image GR\n} bind def\n/GIM {GS /inter exch def /my exch def /mx exch def /py exch def /px exch def /sy exch def /sx exch def \ntranslate \nsx sy scale\n/DeviceGray setcolorspace\n/IDD 8 dict def\nIDD begin\n/ImageType 1 def\n/Width px def\n/Height py def\n/BitsPerComponent 8 def\n/Interpolate inter def\n/DataSource currentfile A85RLE def\n/MultipleDataSources false def\n/ImageMatrix [ px 0 0 py neg 0 py ] def\n/Decode [ 0 1 ] def\nend\n/IMD 8 dict def\nIMD begin\n/ImageType 1 def\n/Width mx def\n/Height my def\n/BitsPerComponent 1 def\n/ImageMatrix [ mx 0 0 my neg 0 my ] def\n/Decode [ 1 0 ] def\nend\n<<\n/ImageType 3\n/InterleaveType 2\n/MaskDict IMD\n/DataDict IDD\n>> image GR\n} bind def\n\n"
              ,(FILE *)this->output), 2 < this->lang_level_)) {
      __s_00 = "/CR { cliprestore } bind def\n";
      __s = "/CS { clipsave } bind def\n";
      goto LAB_001fb03a;
    }
  }
  __s_00 = "/CR { GR } bind def\n";
  __s = "/CS { GS } bind def\n";
LAB_001fb03a:
  fputs(__s,(FILE *)this->output);
  fputs(__s_00,(FILE *)this->output);
  this->page_policy_ = 1;
  fputs("%%EndProlog\n",(FILE *)this->output);
  if (1 < this->lang_level_) {
    fwrite("<< /Policies << /Pagesize 1 >> >> setpagedevice\n",0x30,1,(FILE *)this->output);
  }
  reset(this);
  this->nPages = 0;
  return 0;
}

Assistant:

int Fl_PostScript_Graphics_Driver::start_postscript (int pagecount, 
    enum Fl_Paged_Device::Page_Format format, enum Fl_Paged_Device::Page_Layout layout)
//returns 0 iff OK
{
  int w, h, x;
  if (format == Fl_Paged_Device::A4) {
    left_margin = 18;
    top_margin = 18;
  }
  else {
    left_margin = 12;
    top_margin = 12;
  }
  page_format_ = (enum Fl_Paged_Device::Page_Format)(format | layout);
  if (layout & Fl_Paged_Device::LANDSCAPE){
    ph_ = Fl_Paged_Device::page_formats[format].width;
    pw_ = Fl_Paged_Device::page_formats[format].height;
  } else {
    pw_ = Fl_Paged_Device::page_formats[format].width;
    ph_ = Fl_Paged_Device::page_formats[format].height;
  }
  
  fputs("%!PS-Adobe-3.0\n", output);
  fputs("%%Creator: FLTK\n", output);
  if (lang_level_>1)
    fprintf(output, "%%%%LanguageLevel: %i\n" , lang_level_);
  if ((pages_ = pagecount))
    fprintf(output, "%%%%Pages: %i\n", pagecount);
  else
    fputs("%%Pages: (atend)\n", output);
  fprintf(output, "%%%%BeginFeature: *PageSize %s\n", Fl_Paged_Device::page_formats[format].name );
  w = Fl_Paged_Device::page_formats[format].width;
  h = Fl_Paged_Device::page_formats[format].height;
  if (lang_level_ == 3 && (layout & Fl_Paged_Device::LANDSCAPE) ) { x = w; w = h; h = x; }
  fprintf(output, "<</PageSize[%d %d]>>setpagedevice\n", w, h );
  fputs("%%EndFeature\n", output);
  fputs("%%EndComments\n", output);
  fputs(prolog, output);
  if (lang_level_ > 1) {
    fputs(prolog_2, output);
    }
  if (lang_level_ == 2) {
    fputs(prolog_2_pixmap, output);
    }
  if (lang_level_ > 2)
    fputs(prolog_3, output);
  if (lang_level_ >= 3) {
    fputs("/CS { clipsave } bind def\n", output);
    fputs("/CR { cliprestore } bind def\n", output);
  } else {
    fputs("/CS { GS } bind def\n", output);
    fputs("/CR { GR } bind def\n", output);
  }
  page_policy_ = 1;
  
  
  fputs("%%EndProlog\n",output);
  if (lang_level_ >= 2)
    fprintf(output,"<< /Policies << /Pagesize 1 >> >> setpagedevice\n");
  
  reset();
  nPages=0;
  return 0;
}